

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersections.c
# Opt level: O0

_Bool intersects_triangle_mesh(TriangleMesh mesh,Ray r)

{
  Ray r_00;
  _Bool _Var1;
  
  r_00.o.z = r.o.x;
  r_00.d.x = r.o.y;
  r_00.o._0_8_ = mesh.bvh_root;
  r_00.d.y = r.o.z;
  r_00.d.z = r.d.x;
  _Var1 = intersects_bvh((BVHNode *)mesh.triangle_count,r_00);
  return _Var1;
}

Assistant:

bool intersects_triangle_mesh(TriangleMesh mesh, Ray r) {
#if USE_BVH
    return intersects_bvh(mesh.bvh_root, r);
#else
    bool did_intersect = false;
    for (int i = 0; i < mesh.triangle_count; i++) {
        if (intersects_triangle(mesh.triangles[i], r)) {
            did_intersect = true;
        }
    }
    return did_intersect;
#endif
}